

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O3

bool __thiscall QProcessPrivate::processStarted(QProcessPrivate *this,QString *errorMessage)

{
  int iVar1;
  QObject *receiver;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  QSocketNotifier *pQVar4;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  ssize_t extraout_RDX;
  ssize_t extraout_RDX_00;
  ssize_t bytesRead;
  long in_FS_OFFSET;
  ChildError buf;
  QString local_258;
  Connection local_240;
  ChildError local_238;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  receiver = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  memset(&local_238,0xaa,0x200);
  iVar1 = this->childStartedPipe[0];
  do {
    sVar6 = read(iVar1,&local_238,0x200);
    if (sVar6 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  if (this->stateNotifier != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled(this->stateNotifier,false);
    QObject::disconnect(&this->stateNotifier->super_QObject,(char *)0x0,receiver,(char *)0x0);
  }
  iVar1 = this->childStartedPipe[0];
  do {
    iVar5 = close(iVar1);
    bytesRead = extraout_RDX;
    if (iVar5 != -1) break;
    piVar7 = __errno_location();
    bytesRead = extraout_RDX_00;
  } while (*piVar7 == 4);
  this->childStartedPipe[0] = -1;
  if (sVar6 < 1) {
    if ((sockaddr *)this->stateNotifier != (sockaddr *)0x0) {
      QObject::connect((int)&local_240,(sockaddr *)this->stateNotifier,0x59dc70);
      QMetaObject::Connection::~Connection(&local_240);
      QSocketNotifier::setSocket(this->stateNotifier,(long)this->forkfd);
      QSocketNotifier::setEnabled(this->stateNotifier,true);
    }
    pQVar4 = (this->stdoutChannel).notifier;
    if (pQVar4 != (QSocketNotifier *)0x0) {
      QSocketNotifier::setEnabled(pQVar4,true);
    }
    pQVar4 = (this->stderrChannel).notifier;
    if (pQVar4 != (QSocketNotifier *)0x0) {
      QSocketNotifier::setEnabled(pQVar4,true);
    }
  }
  else if (errorMessage != (QString *)0x0) {
    anon_unknown.dwarf_14cf1db::startFailureErrorMessage(&local_258,&local_238,bytesRead);
    data = &((errorMessage->d).d)->super_QArrayData;
    pcVar2 = (errorMessage->d).ptr;
    (errorMessage->d).d = local_258.d.d;
    (errorMessage->d).ptr = local_258.d.ptr;
    qVar3 = (errorMessage->d).size;
    (errorMessage->d).size = local_258.d.size;
    local_258.d.d = (Data *)data;
    local_258.d.ptr = pcVar2;
    local_258.d.size = qVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return sVar6 < 1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::processStarted(QString *errorMessage)
{
    Q_Q(QProcess);

    ChildError buf;
    ssize_t ret = qt_safe_read(childStartedPipe[0], &buf, sizeof(buf));

    if (stateNotifier) {
        stateNotifier->setEnabled(false);
        stateNotifier->disconnect(q);
    }
    qt_safe_close(childStartedPipe[0]);
    childStartedPipe[0] = -1;

#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::processStarted() == %s", ret <= 0 ? "true" : "false");
#endif

    if (ret <= 0) {  // process successfully started
        if (stateNotifier) {
            QObject::connect(stateNotifier, SIGNAL(activated(QSocketDescriptor)),
                             q, SLOT(_q_processDied()));
            stateNotifier->setSocket(forkfd);
            stateNotifier->setEnabled(true);
        }
        if (stdoutChannel.notifier)
            stdoutChannel.notifier->setEnabled(true);
        if (stderrChannel.notifier)
            stderrChannel.notifier->setEnabled(true);

        return true;
    }

    // did we read an error message?
    if (errorMessage)
        *errorMessage = startFailureErrorMessage(buf, ret);

    return false;
}